

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserialized_statement_verifier.cpp
# Opt level: O2

unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
__thiscall
duckdb::DeserializedStatementVerifier::Create
          (DeserializedStatementVerifier *this,SQLStatement *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  SelectStatement *value;
  MemoryStream stream;
  Allocator allocator;
  undefined1 local_c0 [16];
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  local_b0;
  MemoryStream local_a8;
  Allocator local_78;
  undefined1 local_58 [8];
  _Alloc_hider _Stack_50;
  _Elt_pointer local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  _Elt_pointer prStack_30;
  _Elt_pointer local_28;
  
  local_b0.ptr = parameters.ptr;
  value = SQLStatement::Cast<duckdb::SelectStatement>(statement);
  Allocator::Allocator(&local_78);
  MemoryStream::MemoryStream((MemoryStream *)(local_c0 + 0x18),&local_78,0x200);
  aStack_40._8_8_ = 0;
  prStack_30 = (_Elt_pointer)0x0;
  local_48 = (_Elt_pointer)0x0;
  aStack_40._M_allocated_capacity = 0;
  local_58 = (undefined1  [8])0x0;
  _Stack_50._M_p = (pointer)0x0;
  local_28 = (_Elt_pointer)0x0;
  SerializationOptions::SerializationOptions((SerializationOptions *)local_58);
  BinarySerializer::Serialize<duckdb::SelectStatement>
            (value,(WriteStream *)(local_c0 + 0x18),(SerializationOptions *)local_58);
  ::std::__cxx11::string::~string((string *)&_Stack_50);
  MemoryStream::Rewind((MemoryStream *)(local_c0 + 0x18));
  BinaryDeserializer::Deserialize<duckdb::SelectStatement>
            ((BinaryDeserializer *)local_c0,&local_a8.super_ReadStream);
  make_uniq<duckdb::DeserializedStatementVerifier,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>,duckdb::optional_ptr<std::unordered_map<std::__cxx11::string,duckdb::BoundParameterData,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>>,true>&>
            ((duckdb *)(local_c0 + 8),
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)local_c0,
             (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
              *)(local_c0 + 0x10));
  (this->super_StatementVerifier)._vptr_StatementVerifier = (_func_int **)local_c0._8_8_;
  if ((tuple<duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>)
      local_c0._0_8_ != (_Head_base<0UL,_duckdb::SelectStatement_*,_false>)0x0) {
    (**(code **)(*(_func_int **)local_c0._0_8_ + 8))();
  }
  MemoryStream::~MemoryStream((MemoryStream *)(local_c0 + 0x18));
  Allocator::~Allocator(&local_78);
  return (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         this;
}

Assistant:

unique_ptr<StatementVerifier>
DeserializedStatementVerifier::Create(const SQLStatement &statement,
                                      optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {

	auto &select_stmt = statement.Cast<SelectStatement>();
	Allocator allocator;
	MemoryStream stream(allocator);
	BinarySerializer::Serialize(select_stmt, stream);
	stream.Rewind();
	auto result = BinaryDeserializer::Deserialize<SelectStatement>(stream);

	return make_uniq<DeserializedStatementVerifier>(std::move(result), parameters);
}